

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Mask.cpp
# Opt level: O0

ostream * amrex::operator<<(ostream *os,Mask *m)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  BaseFab<int> *pBVar6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  Box *pBVar10;
  IntVect *pIVar11;
  long lVar12;
  long lVar13;
  Long LVar14;
  BaseFab<int> *in_RSI;
  ostream *in_RDI;
  int k;
  IntVect p;
  IntVect bg;
  IntVect sm;
  int ncomp;
  Long result;
  Box *in_stack_fffffffffffffd98;
  BaseFab<int> *this;
  Box *in_stack_fffffffffffffdd0;
  ostream *in_stack_fffffffffffffdd8;
  int *piVar15;
  int local_1fc;
  undefined8 local_1f8;
  int local_1f0;
  undefined8 local_1ec;
  int local_1e4;
  undefined8 local_1e0;
  int local_1d8;
  int local_1d4;
  BaseFab<int> *local_1d0;
  ostream *local_1c8;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  int local_1ac;
  undefined8 *local_1a8;
  BaseFab<int> *local_1a0;
  undefined8 *local_198;
  Box *local_190;
  undefined8 *local_188;
  undefined8 *local_180;
  undefined4 local_174;
  undefined8 *local_170;
  undefined4 local_164;
  undefined8 *local_160;
  undefined4 local_154;
  undefined8 *local_150;
  undefined4 local_144;
  undefined8 *local_140;
  undefined4 local_134;
  undefined8 *local_130;
  undefined4 local_124;
  Box *local_120;
  undefined4 local_114;
  IntVect *local_110;
  undefined4 local_104;
  Box *local_100;
  undefined4 local_f4;
  IntVect *local_f0;
  undefined4 local_e4;
  undefined8 *local_e0;
  undefined4 local_d4;
  undefined8 *local_d0;
  undefined4 local_c4;
  undefined8 *local_c0;
  undefined4 local_b4;
  undefined8 *local_b0;
  undefined4 local_a4;
  undefined8 *local_a0;
  undefined4 local_94;
  undefined8 *local_90;
  undefined4 local_84;
  undefined8 *local_80;
  long local_78;
  undefined8 *local_70;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  undefined4 local_4c;
  undefined8 *local_48;
  undefined4 local_3c;
  Box *local_38;
  undefined4 local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  Box *local_18;
  undefined4 local_c;
  undefined8 *local_8;
  
  local_1d0 = in_RSI;
  local_1c8 = in_RDI;
  local_1d4 = BaseFab<int>::nComp(in_RSI);
  std::operator<<(local_1c8,"(Mask: ");
  BaseFab<int>::box(local_1d0);
  poVar9 = operator<<(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  poVar9 = std::operator<<(poVar9," ");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_1d4);
  std::operator<<(poVar9,"\n");
  pBVar10 = BaseFab<int>::box(local_1d0);
  pIVar11 = Box::smallEnd(pBVar10);
  local_1e0 = *(undefined8 *)pIVar11->vect;
  local_1d8 = pIVar11->vect[2];
  pBVar10 = BaseFab<int>::box(local_1d0);
  pIVar11 = Box::bigEnd(pBVar10);
  local_1ec = *(undefined8 *)pIVar11->vect;
  local_1e4 = pIVar11->vect[2];
  local_1f8 = local_1e0;
  local_1f0 = local_1d8;
  while( true ) {
    local_1b8 = &local_1f8;
    local_1c0 = &local_1ec;
    local_134 = 2;
    bVar5 = true;
    if (local_1f0 <= local_1e4) {
      local_144 = 2;
      bVar5 = false;
      local_140 = local_1b8;
      if (local_1e4 == local_1f0) {
        local_154 = 1;
        bVar5 = true;
        local_150 = local_1b8;
        if (local_1f8._4_4_ <= local_1ec._4_4_) {
          local_164 = 1;
          bVar5 = false;
          local_160 = local_1b8;
          if (local_1ec._4_4_ == local_1f8._4_4_) {
            local_174 = 0;
            bVar5 = (int)local_1ec < (int)local_1f8;
            local_170 = local_1b8;
          }
        }
      }
    }
    local_188 = local_1b8;
    local_180 = local_1c0;
    local_130 = local_1b8;
    if (bVar5) break;
    operator<<((ostream *)in_stack_fffffffffffffd98,(IntVect *)0x1940abf);
    for (local_1fc = 0; local_1fc < local_1d4; local_1fc = local_1fc + 1) {
      poVar9 = std::operator<<(local_1c8,"  ");
      pBVar6 = local_1d0;
      local_1a0 = local_1d0;
      local_1a8 = &local_1f8;
      local_1ac = local_1fc;
      piVar15 = local_1d0->dptr;
      pBVar10 = &local_1d0->domain;
      local_c = 0;
      local_1c = 0;
      local_78 = (long)((int)local_1f8 - (pBVar10->smallend).vect[0]);
      this = local_1d0;
      local_70 = local_1a8;
      local_68 = pBVar10;
      local_18 = pBVar10;
      local_8 = local_1a8;
      iVar7 = Box::length(pBVar10,0);
      local_28 = local_70;
      local_2c = 1;
      iVar1 = *(int *)((long)local_70 + 4);
      local_3c = 1;
      iVar2 = (pBVar6->domain).smallend.vect[1];
      local_48 = local_70;
      local_4c = 2;
      iVar3 = *(int *)(local_70 + 1);
      local_5c = 2;
      iVar4 = (pBVar6->domain).smallend.vect[2];
      local_58 = pBVar10;
      local_38 = pBVar10;
      iVar8 = Box::length(pBVar10,1);
      lVar12 = iVar7 * ((iVar1 - iVar2) + (iVar3 - iVar4) * iVar8) + local_78;
      lVar13 = (long)local_1ac;
      local_78 = lVar12;
      LVar14 = Box::numPts((Box *)this);
      std::ostream::operator<<(poVar9,piVar15[lVar12 + lVar13 * LVar14]);
    }
    std::operator<<(local_1c8,"\n");
    in_stack_fffffffffffffd98 = BaseFab<int>::box(local_1d0);
    local_198 = &local_1f8;
    local_84 = 0;
    local_94 = 0;
    local_f0 = &in_stack_fffffffffffffd98->bigend;
    local_f4 = 0;
    local_190 = in_stack_fffffffffffffd98;
    local_90 = local_198;
    local_80 = local_198;
    if (local_f0->vect[0] < (int)local_1f8 + 1) {
      local_104 = 0;
      local_a4 = 0;
      local_b4 = 1;
      local_c4 = 1;
      local_110 = &in_stack_fffffffffffffd98->bigend;
      local_114 = 1;
      local_100 = in_stack_fffffffffffffd98;
      local_c0 = local_198;
      local_b0 = local_198;
      local_a0 = local_198;
      if ((in_stack_fffffffffffffd98->bigend).vect[1] < (int)((ulong)local_1f8 >> 0x20) + 1) {
        local_124 = 1;
        local_d4 = 1;
        local_e4 = 2;
        local_120 = in_stack_fffffffffffffd98;
        local_e0 = local_198;
        local_d0 = local_198;
      }
    }
  }
  std::operator<<(local_1c8,")\n");
  return local_1c8;
}

Assistant:

std::ostream&
operator<< (std::ostream& os,
            const Mask&   m)
{
    int ncomp = m.nComp();

    os << "(Mask: " << m.box() << " " << ncomp << "\n";

    IntVect sm = m.box().smallEnd();
    IntVect bg = m.box().bigEnd();
    for (IntVect p = sm; p <= bg; m.box().next(p))
    {
        os << p;
        for (int k = 0; k < ncomp; k++)
            os << "  " << m(p,k);
        os << "\n";
    }
    os << ")\n";

    BL_ASSERT(os.good());

    return os;
}